

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O1

int cuddZddSymmSiftingAux(DdManager *table,int x,int x_low,int x_high)

{
  uint uVar1;
  DdSubtable *pDVar2;
  int iVar3;
  int iVar4;
  DdHalfWord DVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdHalfWord *pDVar8;
  DdNode *pDVar9;
  uint uVar10;
  uint uVar11;
  uint initial_size;
  DdHalfWord x_00;
  uint uVar12;
  DdNode *pDVar13;
  bool bVar14;
  
  initial_size = table->keysZ;
  if (x_low < x) {
    uVar12 = x;
    do {
      iVar4 = uVar12 - 1;
      iVar3 = cuddZddSymmCheck(table,iVar4,uVar12);
      if (iVar3 == 0) break;
      pDVar2 = table->subtableZ;
      uVar11 = pDVar2[iVar4].next;
      pDVar2[iVar4].next = uVar12;
      pDVar2[x].next = uVar11;
      uVar12 = uVar11;
    } while (x_low < (int)uVar11);
  }
  uVar12 = x;
  if (x < x_high) {
    do {
      uVar11 = uVar12 + 1;
      iVar4 = cuddZddSymmCheck(table,uVar12,uVar11);
      if (iVar4 == 0) break;
      pDVar2 = table->subtableZ;
      uVar10 = uVar11;
      do {
        uVar1 = uVar10;
        uVar10 = pDVar2[(int)uVar1].next;
      } while (uVar1 < pDVar2[(int)uVar1].next);
      pDVar2[(int)uVar1].next = pDVar2[(int)uVar12].next;
      pDVar2[(int)uVar12].next = uVar11;
      uVar12 = uVar1;
    } while ((int)uVar1 < x_high);
  }
  if (x == x_low) {
    do {
      uVar12 = x;
      x = table->subtableZ[(int)uVar12].next;
    } while (uVar12 < (uint)x);
    pDVar6 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x_high,initial_size);
    if (pDVar6 == (DdNode *)0x0) {
LAB_0091c531:
      pDVar8 = &table->subtableZ[(int)uVar12].next;
LAB_0091c53f:
      x_00 = *pDVar8;
      uVar11 = x_00;
      do {
        uVar10 = uVar11;
        uVar11 = table->subtableZ[(int)uVar10].next;
      } while (uVar10 < uVar11);
      if (uVar12 - x != uVar10 - x_00) {
LAB_0091c7b5:
        initial_size = table->keysZ;
        pDVar9 = (DdNode *)cuddZddSymmSifting_up(table,x_00,x_low,initial_size);
        pDVar7 = pDVar9;
        goto LAB_0091c7d3;
      }
    }
    else {
      if (pDVar6 == (DdNode *)0x1) {
LAB_0091c3d8:
        pDVar6 = (DdNode *)0x1;
        pDVar7 = (DdNode *)0x0;
        goto LAB_0091c83a;
      }
      if (table->subtableZ[pDVar6->ref].next != pDVar6->ref) {
        if (pDVar6 == (DdNode *)0x0) goto LAB_0091c531;
        pDVar8 = &pDVar6->ref;
        goto LAB_0091c53f;
      }
    }
    iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar6,initial_size);
    pDVar7 = (DdNode *)0x0;
LAB_0091c7d8:
    if (iVar4 != 0) {
      if (pDVar6 != (DdNode *)0x0) {
        pDVar9 = table->nextFree;
        do {
          pDVar13 = pDVar6;
          pDVar6 = (pDVar13->type).kids.T;
          pDVar13->ref = 0;
          pDVar13->next = pDVar9;
          pDVar9 = pDVar13;
        } while (pDVar6 != (DdNode *)0x0);
        table->nextFree = pDVar13;
      }
      iVar4 = 1;
      if (pDVar7 == (DdNode *)0x0) {
        return 1;
      }
      pDVar6 = table->nextFree;
      do {
        pDVar9 = pDVar7;
        pDVar7 = (pDVar9->type).kids.T;
        pDVar9->ref = 0;
        pDVar9->next = pDVar6;
        pDVar6 = pDVar9;
      } while (pDVar7 != (DdNode *)0x0);
      goto LAB_0091c891;
    }
  }
  else {
    if (x_high != x) {
      if (x - x_low <= x_high - x) {
        do {
          uVar12 = table->subtableZ[x].next;
          bVar14 = (uint)x < uVar12;
          x = uVar12;
        } while (bVar14);
        pDVar7 = (DdNode *)cuddZddSymmSifting_up(table,uVar12,x_low,initial_size);
        if (pDVar7 == (DdNode *)0x1) goto LAB_0091c57c;
        if (pDVar7 == (DdNode *)0x0) {
          do {
            DVar5 = uVar12;
            uVar12 = table->subtableZ[(int)DVar5].next;
          } while (DVar5 < uVar12);
        }
        else {
          DVar5 = pDVar7->index;
        }
        uVar12 = table->subtableZ[(int)DVar5].next;
        pDVar9 = (DdNode *)cuddZddSymmSifting_down(table,DVar5,x_high,initial_size);
        pDVar6 = pDVar9;
        if (pDVar9 == (DdNode *)0x0) {
LAB_0091c6bf:
          pDVar8 = &table->subtableZ[(int)DVar5].next;
        }
        else {
          if (pDVar9 == (DdNode *)0x1) {
            pDVar6 = (DdNode *)0x1;
            goto LAB_0091c83a;
          }
          if (table->subtableZ[pDVar9->ref].next == pDVar9->ref) goto LAB_0091c7d3;
          if (pDVar9 == (DdNode *)0x0) goto LAB_0091c6bf;
          pDVar8 = &pDVar9->ref;
        }
        x_00 = *pDVar8;
        uVar11 = x_00;
        do {
          uVar10 = uVar11;
          uVar11 = table->subtableZ[(int)uVar10].next;
        } while (uVar10 < uVar11);
        if (DVar5 - uVar12 == uVar10 - x_00) goto LAB_0091c7d3;
        if (pDVar7 != (DdNode *)0x0) {
          pDVar9 = table->nextFree;
          do {
            pDVar13 = pDVar7;
            pDVar7 = (pDVar13->type).kids.T;
            pDVar13->ref = 0;
            pDVar13->next = pDVar9;
            pDVar9 = pDVar13;
          } while (pDVar7 != (DdNode *)0x0);
          table->nextFree = pDVar13;
        }
        goto LAB_0091c7b5;
      }
      do {
        uVar12 = x;
        x = table->subtableZ[(int)uVar12].next;
      } while (uVar12 < (uint)x);
      pDVar6 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x_high,initial_size);
      if (pDVar6 == (DdNode *)0x0) {
        pDVar8 = &table->subtableZ[(int)uVar12].next;
      }
      else {
        if (pDVar6 == (DdNode *)0x1) goto LAB_0091c3d8;
        pDVar8 = &pDVar6->ref;
      }
      DVar5 = *pDVar8;
      uVar12 = DVar5;
      do {
        uVar11 = uVar12;
        uVar12 = table->subtableZ[(int)uVar11].next;
      } while (uVar11 < uVar12);
      pDVar9 = (DdNode *)cuddZddSymmSifting_up(table,DVar5,x_low,initial_size);
      if (pDVar9 == (DdNode *)0x1) {
        pDVar7 = (DdNode *)0x1;
        goto LAB_0091c83a;
      }
      pDVar7 = pDVar9;
      if (pDVar9 == (DdNode *)0x0) {
        uVar10 = DVar5;
        do {
          uVar12 = uVar10;
          uVar10 = table->subtableZ[(int)uVar12].next;
        } while (uVar12 < uVar10);
      }
      else {
        uVar12 = pDVar9->index;
        if (table->subtableZ[uVar12].next == uVar12) goto LAB_0091c7d3;
      }
      if (uVar11 - DVar5 == uVar12 - table->subtableZ[(int)uVar12].next) goto LAB_0091c7d3;
      if (pDVar6 != (DdNode *)0x0) {
        pDVar9 = table->nextFree;
        do {
          pDVar13 = pDVar6;
          pDVar6 = (pDVar13->type).kids.T;
          pDVar13->ref = 0;
          pDVar13->next = pDVar9;
          pDVar9 = pDVar13;
        } while (pDVar6 != (DdNode *)0x0);
        table->nextFree = pDVar13;
      }
      initial_size = table->keysZ;
LAB_0091c77c:
      pDVar9 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x_high,initial_size);
      pDVar6 = pDVar9;
LAB_0091c7d3:
      iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar9,initial_size);
      goto LAB_0091c7d8;
    }
    do {
      uVar11 = table->subtableZ[x].next;
      bVar14 = (uint)x < uVar11;
      x = uVar11;
      uVar12 = uVar11;
    } while (bVar14);
    do {
      uVar10 = uVar12;
      uVar12 = table->subtableZ[(int)uVar10].next;
    } while (uVar10 < uVar12);
    pDVar7 = (DdNode *)cuddZddSymmSifting_up(table,uVar11,x_low,initial_size);
    if (pDVar7 != (DdNode *)0x1) {
      if (pDVar7 == (DdNode *)0x0) {
        uVar1 = uVar11;
        do {
          uVar12 = uVar1;
          uVar1 = table->subtableZ[(int)uVar12].next;
        } while (uVar12 < uVar1);
LAB_0091c59e:
        if (uVar10 - uVar11 != uVar12 - table->subtableZ[(int)uVar12].next) {
          initial_size = table->keysZ;
          goto LAB_0091c77c;
        }
      }
      else {
        uVar12 = pDVar7->index;
        if (table->subtableZ[uVar12].next != uVar12) goto LAB_0091c59e;
      }
      iVar4 = cuddZddSymmSiftingBackward(table,(Move *)pDVar7,initial_size);
      pDVar6 = (DdNode *)0x0;
      goto LAB_0091c7d8;
    }
LAB_0091c57c:
    pDVar7 = (DdNode *)0x1;
    pDVar6 = (DdNode *)0x0;
  }
LAB_0091c83a:
  if ((DdNode *)0x1 < pDVar6) {
    pDVar9 = table->nextFree;
    do {
      pDVar13 = pDVar6;
      pDVar6 = (pDVar13->type).kids.T;
      pDVar13->ref = 0;
      pDVar13->next = pDVar9;
      pDVar9 = pDVar13;
    } while (pDVar6 != (DdNode *)0x0);
    table->nextFree = pDVar13;
  }
  iVar4 = 0;
  if (pDVar7 < (DdNode *)0x2) {
    return 0;
  }
  pDVar6 = table->nextFree;
  do {
    pDVar9 = pDVar7;
    pDVar7 = (pDVar9->type).kids.T;
    pDVar9->ref = 0;
    pDVar9->next = pDVar6;
    pDVar6 = pDVar9;
  } while (pDVar7 != (DdNode *)0x0);
LAB_0091c891:
  table->nextFree = pDVar9;
  return iVar4;
}

Assistant:

static int
cuddZddSymmSiftingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high)
{
    Move *move;
    Move *move_up;      /* list of up move */
    Move *move_down;    /* list of down move */
    int  initial_size;
    int  result;
    int  i;
    int  topbot;        /* index to either top or bottom of symmetry group */
    int  init_group_size, final_group_size;

    initial_size = table->keysZ;

    move_down = NULL;
    move_up = NULL;

    /* Look for consecutive symmetries above x. */
    for (i = x; i > x_low; i--) {
        if (!cuddZddSymmCheck(table, i - 1, i))
            break;
        /* find top of i-1's symmetry */
        topbot = table->subtableZ[i - 1].next;
        table->subtableZ[i - 1].next = i;
        table->subtableZ[x].next = topbot;
        /* x is bottom of group so its symmetry is top of i-1's
           group */
        i = topbot + 1; /* add 1 for i--, new i is top of symm group */
    }
    /* Look for consecutive symmetries below x. */
    for (i = x; i < x_high; i++) {
        if (!cuddZddSymmCheck(table, i, i + 1))
            break;
        /* find bottom of i+1's symm group */
        topbot = i + 1;
        while ((unsigned) topbot < table->subtableZ[topbot].next)
            topbot = table->subtableZ[topbot].next;

        table->subtableZ[topbot].next = table->subtableZ[i].next;
        table->subtableZ[i].next = i + 1;
        i = topbot - 1; /* add 1 for i++,
                           new i is bottom of symm group */
    }

    /* Now x maybe in the middle of a symmetry group. */
    if (x == x_low) { /* Sift down */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL)
                x = move_down->y;
            else
                x = table->subtableZ[x].next;
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table,
                    move_down, initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if (x == x_high) { /* Sift up */
        /* Find top of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_low, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
                pass */
            if (move_up != NULL)
                x = move_up->x;
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if ((x - x_low) > (x_high - x)) { /* must go down first:
                                                shorter */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down != NULL) {
            x = move_down->y;
        }
        else {
            x = table->subtableZ[x].next;
        }
        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_up != NULL) {
                x = move_up->x;
            }
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                while (move_down != NULL) {
                    move = move_down->next;
                    cuddDeallocMove(table, move_down);
                    move_down = move;
                }
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else { /* moving up first:shorter */
        /* Find top of x's symmetry group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up != NULL) {
            x = move_up->x;
        }
        else {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
        }
        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL) {
                x = move_down->y;
            }
            else {
                x = table->subtableZ[x].next;
            }
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetries detected,
                   go back to best position */
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
            else {
                while (move_up != NULL) {
                    move = move_up->next;
                    cuddDeallocMove(table, move_up);
                    move_up = move;
                }
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }

    while (move_down != NULL) {
        move = move_down->next;
        cuddDeallocMove(table, move_down);
        move_down = move;
    }
    while (move_up != NULL) {
        move = move_up->next;
        cuddDeallocMove(table, move_up);
        move_up = move;
    }

    return(1);

cuddZddSymmSiftingAuxOutOfMem:
    if (move_down != ZDD_MV_OOM) {
        while (move_down != NULL) {
            move = move_down->next;
            cuddDeallocMove(table, move_down);
            move_down = move;
        }
    }
    if (move_up != ZDD_MV_OOM) {
        while (move_up != NULL) {
            move = move_up->next;
            cuddDeallocMove(table, move_up);
            move_up = move;
        }
    }

    return(0);

}